

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<bidfx_public_api::price::pixie::EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test>
::CreateTest(TestFactoryImpl<bidfx_public_api::price::pixie::EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test>
             *this)

{
  Test *this_00;
  TestFactoryImpl<bidfx_public_api::price::pixie::EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test>
  *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  bidfx_public_api::price::pixie::
  EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test::
  EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test
            ((EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }